

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void * nn_allocmsg(size_t size,int type)

{
  int iVar1;
  int *piVar2;
  void *local_28;
  void *result;
  int rc;
  int type_local;
  size_t size_local;
  
  result._4_4_ = type;
  _rc = size;
  result._0_4_ = nn_chunk_alloc(size,type,&local_28);
  if ((int)result == 0) {
    size_local = (size_t)local_28;
  }
  else {
    iVar1 = -(int)result;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

void *nn_allocmsg (size_t size, int type)
{
    int rc;
    void *result;

    rc = nn_chunk_alloc (size, type, &result);
    if (rc == 0)
        return result;
    errno = -rc;
    return NULL;
}